

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parseExtGNU_AttributeSpecifierList_AtFirst
          (Parser *this,SpecifierListSyntax **specList)

{
  bool bVar1;
  SyntaxKind SVar2;
  SyntaxToken *pSVar3;
  ostream *poVar4;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *pSVar5;
  SpecifierSyntax *local_30;
  SpecifierSyntax *spec;
  SpecifierListSyntax **specList_cur;
  SpecifierListSyntax **specList_local;
  Parser *this_local;
  
  specList_cur = specList;
  specList_local = (SpecifierListSyntax **)this;
  pSVar3 = peek(this,1);
  SVar2 = SyntaxToken::kind(pSVar3);
  if (SVar2 == KeywordAlias___attribute) {
    spec = (SpecifierSyntax *)specList_cur;
    do {
      local_30 = (SpecifierSyntax *)0x0;
      bVar1 = parseExtGNU_AttributeSpecifier_AtFirst(this,&local_30);
      if (!bVar1) {
        return false;
      }
      pSVar5 = makeNode<psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>,psy::C::SpecifierSyntax*&>
                         (this,&local_30);
      (spec->super_SyntaxNode).super_Managed._vptr_Managed = (_func_int **)pSVar5;
      spec = (SpecifierSyntax *)((spec->super_SyntaxNode).super_Managed._vptr_Managed + 2);
      pSVar3 = peek(this,1);
      SVar2 = SyntaxToken::kind(pSVar3);
    } while (SVar2 == KeywordAlias___attribute);
    this_local._7_1_ = true;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x653);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"assert failure: `__attribute__\'");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::parseExtGNU_AttributeSpecifierList_AtFirst(SpecifierListSyntax*& specList)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword_ExtGNU___attribute__,
                  return false,
                  "assert failure: `__attribute__'");

    SpecifierListSyntax** specList_cur = &specList;

    do {
        SpecifierSyntax* spec = nullptr;
        if (!parseExtGNU_AttributeSpecifier_AtFirst(spec))
            return false;

        *specList_cur = makeNode<SpecifierListSyntax>(spec);
        specList_cur = &(*specList_cur)->next;
    }
    while (peek().kind() == SyntaxKind::Keyword_ExtGNU___attribute__);

    return true;
}